

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicStruct::Reader::verifySetInUnion(Reader *this,Field field)

{
  Field field_00;
  bool bVar1;
  Reader local_e8;
  ArrayPtr<const_char> local_b8;
  Reader local_a8;
  ArrayPtr<const_char> local_78;
  Fault local_68;
  Fault f;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  bool local_1a;
  DebugExpression<bool> local_19;
  Reader *pRStack_18;
  DebugExpression<bool> _kjCondition;
  Reader *this_local;
  
  pRStack_18 = this;
  memcpy(&f,&field,0x40);
  field_00._8_8_ = uStack_58;
  field_00.parent.super_Schema.raw = (Schema)(Schema)f.exception;
  field_00.proto._reader.segment = (SegmentReader *)local_50;
  field_00.proto._reader.capTable = (CapTableReader *)uStack_48;
  field_00.proto._reader.data = (void *)local_40;
  field_00.proto._reader.pointers = (WirePointer *)uStack_38;
  field_00.proto._reader._32_8_ = local_30;
  field_00.proto._reader._40_8_ = uStack_28;
  local_1a = isSetInUnion(this,field_00);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (!bVar1) {
    StructSchema::Field::getProto(&local_a8,&field);
    local_78 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_a8);
    Schema::getProto(&local_e8,(Schema *)this);
    local_b8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_e8);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[66],capnp::Text::Reader,capnp::Text::Reader>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x8f,FAILED,"isSetInUnion(field)",
               "_kjCondition,\"Tried to get() a union member which is not currently initialized.\", field.getProto().getName(), schema.getProto().getDisplayName()"
               ,&local_19,
               (char (*) [66])"Tried to get() a union member which is not currently initialized.",
               (Reader *)&local_78,(Reader *)&local_b8);
    kj::_::Debug::Fault::fatal(&local_68);
  }
  return;
}

Assistant:

void DynamicStruct::Reader::verifySetInUnion(StructSchema::Field field) const {
  KJ_REQUIRE(isSetInUnion(field),
      "Tried to get() a union member which is not currently initialized.",
      field.getProto().getName(), schema.getProto().getDisplayName());
}